

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Search(int iters,int nbytes,char *regexp,SearchImpl *search)

{
  StringPiece local_60 [2];
  string local_40 [8];
  string s;
  SearchImpl *search_local;
  char *regexp_local;
  int nbytes_local;
  int iters_local;
  
  StopBenchmarkTiming();
  std::__cxx11::string::string(local_40);
  MakeText((string *)local_40,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  StringPiece::StringPiece(local_60,(string *)local_40);
  (*search)(iters,regexp,local_60,kUnanchored,false);
  SetBenchmarkBytesProcessed((long)iters * (long)nbytes);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Search(int iters, int nbytes, const char* regexp, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, regexp, s, Prog::kUnanchored, false);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}